

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_identifier_expression(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  size_t sVar1;
  gtoken_s token_00;
  char *identifier;
  gnode_t *pgVar2;
  gtoken_s token;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  char *local_20;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  identifier = parse_identifier(parser);
  if (identifier == (char *)0x0) {
    pgVar2 = (gnode_t *)0x0;
  }
  else {
    gravity_lexer_token(lexer);
    sVar1 = parser->declarations->n;
    if (sVar1 == 0) {
      pgVar2 = (gnode_t *)0x0;
    }
    else {
      pgVar2 = parser->declarations->p[sVar1 - 1];
    }
    token_00._8_8_ = uStack_38;
    token_00._0_8_ = local_40;
    token_00._16_8_ = local_30;
    token_00._24_8_ = uStack_28;
    token_00.value = local_20;
    pgVar2 = gnode_identifier_expr_create(token_00,identifier,(char *)0x0,pgVar2);
  }
  return pgVar2;
}

Assistant:

static gnode_t *parse_identifier_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_identifier_expression");
    DECLARE_LEXER;

    const char *identifier = parse_identifier(parser);
    if (!identifier) return NULL;
    DEBUG_PARSER("IDENTIFIER: %s", identifier);

    gtoken_s token = gravity_lexer_token(lexer);
    return gnode_identifier_expr_create(token, identifier, NULL, LAST_DECLARATION());
}